

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleArrayTests.cpp
# Opt level: O0

void __thiscall
ParticleArrayTest_Back_Test<pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)2>_>_>::TestBody
          (ParticleArrayTest_Back_Test<pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)2>_>_>
           *this)

{
  Particle<(pica::Dimension)2> a;
  Particle<(pica::Dimension)2> a_00;
  Particle<(pica::Dimension)2> b;
  Particle<(pica::Dimension)2> b_00;
  bool bVar1;
  ParticleRef pPVar2;
  undefined8 in_RDI;
  AssertionResult gtest_ar__1;
  ParticleArray particlesCopy;
  AssertionResult gtest_ar_;
  ParticleType particle;
  int i;
  ParticleArray particles;
  ConstParticleRef in_stack_fffffffffffffd48;
  ConstParticleRef pPVar3;
  String *in_stack_fffffffffffffd50;
  String *this_00;
  char *pcVar4;
  undefined8 uVar5;
  int iVar6;
  char *pcVar7;
  undefined8 uVar8;
  Type TVar9;
  AssertHelper *pAVar10;
  BaseParticleFixture<pica::Particle<(pica::Dimension)2>_> *in_stack_fffffffffffffd90;
  Message *pMVar11;
  AssertHelper *pAVar12;
  char *pcVar13;
  BaseParticleFixture<pica::Particle<(pica::Dimension)2>_> *pBVar14;
  AssertionResult *in_stack_fffffffffffffdc8;
  undefined1 *in_stack_fffffffffffffdd0;
  undefined7 in_stack_fffffffffffffdd8;
  undefined1 in_stack_fffffffffffffddf;
  ConstParticleRef in_stack_fffffffffffffde0;
  undefined1 *puVar15;
  undefined7 in_stack_fffffffffffffdf0;
  undefined1 in_stack_fffffffffffffdf7;
  char *in_stack_fffffffffffffe08;
  undefined1 in_stack_fffffffffffffe10 [24];
  double in_stack_fffffffffffffe28;
  BaseParticleFixture<pica::Particle<(pica::Dimension)2>_> *in_stack_fffffffffffffe30;
  double in_stack_fffffffffffffe38;
  double in_stack_fffffffffffffe40;
  Message *in_stack_fffffffffffffe48;
  AssertionResult local_150 [2];
  String local_128 [2];
  double local_108;
  double dStack_100;
  double local_f8;
  double dStack_f0;
  Message *local_e8;
  AssertHelper *pAStack_e0;
  char *local_d8;
  BaseParticleFixture<pica::Particle<(pica::Dimension)2>_> *pBStack_d0;
  ConstParticleRef local_c8;
  String *pSStack_c0;
  undefined8 local_b8;
  char *pcStack_b0;
  undefined8 local_a8;
  char *pcStack_a0;
  undefined8 local_98;
  AssertHelper *pAStack_90;
  AssertionResult local_88 [2];
  ConstParticleRef local_68;
  String *pSStack_60;
  undefined8 local_58;
  char *pcStack_50;
  undefined8 local_48;
  char *pcStack_40;
  undefined8 local_38;
  AssertHelper *pAStack_30;
  int local_24;
  
  pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)2>_>::ParticleArrayAoS
            ((ParticleArrayAoS<pica::Particle<(pica::Dimension)2>_> *)0x21ed6c);
  for (local_24 = 0; local_24 < 0xd; local_24 = local_24 + 1) {
    BaseParticleFixture<pica::Particle<(pica::Dimension)2>_>::randomParticle
              (in_stack_fffffffffffffd90);
    pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)2>_>::pushBack
              ((ParticleArrayAoS<pica::Particle<(pica::Dimension)2>_> *)in_stack_fffffffffffffd50,
               in_stack_fffffffffffffd48);
    local_98 = local_38;
    pAStack_90 = pAStack_30;
    local_a8 = local_48;
    pcStack_a0 = pcStack_40;
    local_b8 = local_58;
    pcStack_b0 = pcStack_50;
    local_c8 = local_68;
    pSStack_c0 = pSStack_60;
    pPVar2 = pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)2>_>::back
                       ((ParticleArrayAoS<pica::Particle<(pica::Dimension)2>_> *)0x21ee00);
    local_108 = (pPVar2->position).x;
    dStack_100 = (pPVar2->position).y;
    local_f8 = (pPVar2->p).x;
    dStack_f0 = (pPVar2->p).y;
    pMVar11 = (Message *)(pPVar2->p).z;
    pAVar12 = (AssertHelper *)pPVar2->factor;
    pcVar13 = (char *)pPVar2->invGamma;
    pBVar14 = *(BaseParticleFixture<pica::Particle<(pica::Dimension)2>_> **)&pPVar2->typeIndex;
    a.position.y._0_7_ = in_stack_fffffffffffffdd8;
    a.position.x = (double)in_stack_fffffffffffffdd0;
    a.position.y._7_1_ = in_stack_fffffffffffffddf;
    a.p.x = (double)in_stack_fffffffffffffde0;
    a.p.y = (double)&stack0xfffffffffffffd48;
    a.p.z._0_7_ = in_stack_fffffffffffffdf0;
    a.p.z._7_1_ = in_stack_fffffffffffffdf7;
    a.factor = (FactorType)pPVar2;
    a.invGamma = (GammaType)in_RDI;
    a._56_8_ = in_stack_fffffffffffffe08;
    b.p.y = in_stack_fffffffffffffe28;
    b.position.x = (double)SUB168(in_stack_fffffffffffffe10._0_16_,0);
    b.position.y = (double)SUB168(in_stack_fffffffffffffe10._0_16_,8);
    b.p.x = (double)in_stack_fffffffffffffe10._16_8_;
    b.p.z = (double)in_stack_fffffffffffffe30;
    b.factor = in_stack_fffffffffffffe38;
    b.invGamma = in_stack_fffffffffffffe40;
    b._56_8_ = in_stack_fffffffffffffe48;
    pPVar3 = local_c8;
    this_00 = pSStack_c0;
    pcVar4 = pcStack_b0;
    uVar5 = local_a8;
    pcVar7 = pcStack_a0;
    uVar8 = local_98;
    pAVar10 = pAStack_90;
    puVar15 = &stack0xfffffffffffffd48;
    local_e8 = pMVar11;
    pAStack_e0 = pAVar12;
    local_d8 = pcVar13;
    pBStack_d0 = pBVar14;
    in_stack_fffffffffffffdf7 =
         BaseParticleFixture<pica::Particle<(pica::Dimension)2>>::
         eqParticles_<pica::Particle<(pica::Dimension)2>,pica::Particle<(pica::Dimension)2>>
                   (pBVar14,a,b);
    TVar9 = (Type)((ulong)uVar8 >> 0x20);
    iVar6 = (int)((ulong)uVar5 >> 0x20);
    testing::AssertionResult::AssertionResult
              ((AssertionResult *)this_00,SUB81((ulong)pPVar3 >> 0x38,0));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_88);
    if (!bVar1) {
      testing::Message::Message((Message *)pAVar10);
      testing::internal::GetBoolAssertionFailureMessage
                (in_stack_fffffffffffffdc8,(char *)pBVar14,pcVar13,(char *)pAVar12);
      testing::internal::String::c_str(local_128);
      testing::internal::AssertHelper::AssertHelper(pAVar10,TVar9,pcVar7,iVar6,pcVar4);
      testing::internal::AssertHelper::operator=(pAVar12,pMVar11);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
      testing::internal::String::~String(this_00);
      testing::Message::~Message((Message *)0x21efb7);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x21f04e);
    pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)2>_>::ParticleArrayAoS
              ((ParticleArrayAoS<pica::Particle<(pica::Dimension)2>_> *)this_00,
               (ParticleArrayAoS<pica::Particle<(pica::Dimension)2>_> *)pPVar3);
    pAVar10 = pAStack_30;
    uVar8 = local_38;
    pcVar7 = pcStack_40;
    uVar5 = local_48;
    pcVar4 = pcStack_50;
    in_stack_fffffffffffffd50 = pSStack_60;
    in_stack_fffffffffffffd48 = local_68;
    in_stack_fffffffffffffde0 =
         pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)2>_>::back
                   ((ParticleArrayAoS<pica::Particle<(pica::Dimension)2>_> *)0x21f0b2);
    in_stack_fffffffffffffe28 = (in_stack_fffffffffffffde0->position).x;
    in_stack_fffffffffffffd90 =
         (BaseParticleFixture<pica::Particle<(pica::Dimension)2>_> *)
         (in_stack_fffffffffffffde0->position).y;
    in_stack_fffffffffffffe38 = (in_stack_fffffffffffffde0->p).x;
    in_stack_fffffffffffffe40 = (in_stack_fffffffffffffde0->p).y;
    pMVar11 = (Message *)(in_stack_fffffffffffffde0->p).z;
    pAVar12 = (AssertHelper *)in_stack_fffffffffffffde0->factor;
    pcVar13 = (char *)in_stack_fffffffffffffde0->invGamma;
    pBVar14 = *(BaseParticleFixture<pica::Particle<(pica::Dimension)2>_> **)
               &in_stack_fffffffffffffde0->typeIndex;
    a_00.position.y._0_7_ = in_stack_fffffffffffffdd8;
    a_00.position.x = (double)&stack0xfffffffffffffd48;
    a_00.position.y._7_1_ = in_stack_fffffffffffffddf;
    a_00.p.x = (double)in_stack_fffffffffffffde0;
    a_00.p.y = (double)puVar15;
    a_00.p.z._0_7_ = in_stack_fffffffffffffdf0;
    a_00.p.z._7_1_ = in_stack_fffffffffffffdf7;
    a_00.factor = (FactorType)pPVar2;
    a_00.invGamma = (GammaType)in_RDI;
    a_00._56_8_ = in_stack_fffffffffffffe08;
    b_00.p.y = in_stack_fffffffffffffe28;
    b_00.position.x = (double)SUB168(in_stack_fffffffffffffe10._0_16_,0);
    b_00.position.y = (double)SUB168(in_stack_fffffffffffffe10._0_16_,8);
    b_00.p.x = (double)in_stack_fffffffffffffe10._16_8_;
    b_00.p.z = (double)in_stack_fffffffffffffd90;
    b_00.factor = in_stack_fffffffffffffe38;
    b_00.invGamma = in_stack_fffffffffffffe40;
    b_00._56_8_ = pMVar11;
    in_stack_fffffffffffffdd0 = &stack0xfffffffffffffd48;
    in_stack_fffffffffffffe30 = in_stack_fffffffffffffd90;
    in_stack_fffffffffffffe48 = pMVar11;
    in_stack_fffffffffffffddf =
         BaseParticleFixture<pica::Particle<(pica::Dimension)2>>::
         eqParticles_<pica::Particle<(pica::Dimension)2>,pica::Particle<(pica::Dimension)2>>
                   (pBVar14,a_00,b_00);
    TVar9 = (Type)((ulong)uVar8 >> 0x20);
    iVar6 = (int)((ulong)uVar5 >> 0x20);
    testing::AssertionResult::AssertionResult
              ((AssertionResult *)in_stack_fffffffffffffd50,
               SUB81((ulong)in_stack_fffffffffffffd48 >> 0x38,0));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_150);
    if (!bVar1) {
      testing::Message::Message((Message *)pAVar10);
      testing::internal::GetBoolAssertionFailureMessage
                (in_stack_fffffffffffffdc8,(char *)pBVar14,pcVar13,(char *)pAVar12);
      testing::internal::String::c_str((String *)&stack0xfffffffffffffe08);
      testing::internal::AssertHelper::AssertHelper(pAVar10,TVar9,pcVar7,iVar6,pcVar4);
      testing::internal::AssertHelper::operator=(pAVar12,pMVar11);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffd50);
      testing::internal::String::~String(in_stack_fffffffffffffd50);
      testing::Message::~Message((Message *)0x21f27b);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x21f30f);
    pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)2>_>::~ParticleArrayAoS
              ((ParticleArrayAoS<pica::Particle<(pica::Dimension)2>_> *)0x21f31c);
  }
  pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)2>_>::~ParticleArrayAoS
            ((ParticleArrayAoS<pica::Particle<(pica::Dimension)2>_> *)0x21f35b);
  return;
}

Assistant:

TYPED_TEST(ParticleArrayTest, Back)
{
    typedef typename ParticleArrayTest<TypeParam>::ParticleArray ParticleArray;
    typedef typename ParticleArrayTest<TypeParam>::Particle ParticleType;

    ParticleArray particles;
    for (int i = 0; i < 13; i++) {
        ParticleType particle = this->randomParticle();
        particles.pushBack(particle);
        EXPECT_TRUE(this->eqParticles_(particle, particles.back()));
        const ParticleArray particlesCopy = particles;
        EXPECT_TRUE(this->eqParticles_(particle, particlesCopy.back()));
    }
}